

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::CheckSignature(TypeChecker *this,TypeVector *sig,char *desc)

{
  Type TVar1;
  Result RVar2;
  pointer pTVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  Type local_40;
  char *local_38;
  
  pTVar3 = (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar3;
  if (lVar5 == 0) {
    RVar2.enum_ = Ok;
  }
  else {
    uVar6 = lVar5 >> 3;
    iVar4 = -1;
    uVar7 = 0;
    bVar8 = 0;
    local_38 = desc;
    do {
      TVar1 = pTVar3[uVar7];
      local_40.enum_ = Any;
      local_40.type_index_ = 0;
      RVar2 = PeekType(this,(int)uVar6 + iVar4,&local_40);
      bVar8 = bVar8 | RVar2.enum_ == Error |
              (local_40 != TVar1 && (local_40.enum_ != Any && TVar1.enum_ != Any));
      uVar7 = uVar7 + 1;
      pTVar3 = (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (long)(sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pTVar3 >> 3;
      iVar4 = iVar4 + -1;
    } while (uVar7 < uVar6);
    RVar2.enum_ = (Enum)bVar8;
    desc = local_38;
  }
  PrintStackIfFailedV(this,RVar2,desc,sig,false);
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::CheckSignature(const TypeVector& sig, const char* desc) {
  Result result = Result::Ok;
  for (size_t i = 0; i < sig.size(); ++i) {
    result |= PeekAndCheckType(sig.size() - i - 1, sig[i]);
  }
  PrintStackIfFailedV(result, desc, sig, /*is_end=*/false);
  return result;
}